

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_or_null_simplification.cpp
# Opt level: O2

void __thiscall
duckdb::EqualOrNullSimplification::EqualOrNullSimplification
          (EqualOrNullSimplification *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pEVar8;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_50;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_48;
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> local_40;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_38;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_30;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_28;
  ExpressionType local_19;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_01788598;
  make_uniq<duckdb::ConjunctionExpressionMatcher>();
  local_50._M_head_impl._0_1_ = 0x33;
  make_uniq<duckdb::SpecificExpressionTypeMatcher,duckdb::ExpressionType>
            ((duckdb *)&local_48,(ExpressionType *)&local_50);
  _Var3._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_28);
  _Var1._M_head_impl =
       (pCVar6->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar6->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)_Var3._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_48._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_28);
  pCVar6->policy = SOME;
  make_uniq<duckdb::ComparisonExpressionMatcher>();
  local_38._M_head_impl._0_1_ = 0x19;
  make_uniq<duckdb::SpecificExpressionTypeMatcher,duckdb::ExpressionType>
            ((duckdb *)&local_50,(ExpressionType *)&local_38);
  _Var3._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  pCVar7 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_48);
  _Var1._M_head_impl =
       (pCVar7->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar7->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)_Var3._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_50._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  pCVar7 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_48);
  pCVar7->policy = SOME;
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_28);
  local_50._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar6->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_50);
  if (local_50._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::ConjunctionExpressionMatcher>();
  local_40._M_head_impl._0_1_ = 0x32;
  make_uniq<duckdb::SpecificExpressionTypeMatcher,duckdb::ExpressionType>
            ((duckdb *)&local_38,(ExpressionType *)&local_40);
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ExpressionMatcher *)0x0;
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  _Var1._M_head_impl =
       (pCVar6->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar6->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)_Var2._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  pCVar6->policy = SOME;
  make_uniq<duckdb::ExpressionMatcher>();
  local_30._M_head_impl._0_1_ = 0xe;
  make_uniq<duckdb::SpecificExpressionTypeMatcher,duckdb::ExpressionType>
            ((duckdb *)&local_40,(ExpressionType *)&local_30);
  _Var4._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ExpressionTypeMatcher *)0x0;
  pEVar8 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                         *)&local_38);
  _Var1._M_head_impl =
       (pEVar8->expr_type).
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pEVar8->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_40._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  make_uniq<duckdb::ExpressionMatcher>();
  local_19 = OPERATOR_IS_NULL;
  make_uniq<duckdb::SpecificExpressionTypeMatcher,duckdb::ExpressionType>
            ((duckdb *)&local_30,&local_19);
  _Var2._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (ExpressionMatcher *)0x0;
  pEVar8 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                         *)&local_40);
  _Var1._M_head_impl =
       (pEVar8->expr_type).
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pEVar8->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)_Var2._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_30._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_30._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar6->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_38);
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar6->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_40);
  pCVar6 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_28);
  local_30._M_head_impl = &(local_50._M_head_impl)->super_ExpressionMatcher;
  local_50._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar6->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_30);
  if ((ComparisonExpressionMatcher *)local_30._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((ExpressionMatcher *)&(local_30._M_head_impl)->_vptr_ExpressionMatcher)->
      _vptr_ExpressionMatcher[1])();
  }
  _Var5._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ExpressionMatcher *)0x0;
  _Var2._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var2._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_40._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  if (local_50._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_48._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_28._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_28._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

EqualOrNullSimplification::EqualOrNullSimplification(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on OR conjunction
	auto op = make_uniq<ConjunctionExpressionMatcher>();
	op->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::CONJUNCTION_OR);
	op->policy = SetMatcher::Policy::SOME;

	// equi comparison on one side
	auto equal_child = make_uniq<ComparisonExpressionMatcher>();
	equal_child->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::COMPARE_EQUAL);
	equal_child->policy = SetMatcher::Policy::SOME;
	op->matchers.push_back(std::move(equal_child));

	// AND conjunction on the other
	auto and_child = make_uniq<ConjunctionExpressionMatcher>();
	and_child->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::CONJUNCTION_AND);
	and_child->policy = SetMatcher::Policy::SOME;

	// IS NULL tests inside AND
	auto isnull_child = make_uniq<ExpressionMatcher>();
	isnull_child->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::OPERATOR_IS_NULL);
	// I could try to use std::make_uniq for a copy, but it's available from C++14 only
	auto isnull_child2 = make_uniq<ExpressionMatcher>();
	isnull_child2->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::OPERATOR_IS_NULL);
	and_child->matchers.push_back(std::move(isnull_child));
	and_child->matchers.push_back(std::move(isnull_child2));

	op->matchers.push_back(std::move(and_child));
	root = std::move(op);
}